

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_write_val_anchor(Parser *this,size_t node_id)

{
  NodeType_e NVar1;
  Tree *this_00;
  code *pcVar2;
  csubstr ref;
  bool bVar3;
  NodeData *pNVar4;
  csubstr *pcVar5;
  size_t sVar6;
  char *pcVar7;
  basic_substring<const_char> local_48;
  undefined8 local_38;
  csubstr cStack_30;
  
  if ((this->m_val_anchor).str != (char *)0x0 && (this->m_val_anchor).len != 0) {
    Tree::set_val_anchor(this->m_tree,node_id,this->m_val_anchor);
    (this->m_val_anchor).str = (char *)0x0;
    (this->m_val_anchor).len = 0;
  }
  pNVar4 = Tree::_p(this->m_tree,node_id);
  if (((pNVar4->m_type).type & VAL) == NOTYPE) {
    pcVar7 = "";
    sVar6 = 0;
  }
  else {
    pcVar5 = Tree::val(this->m_tree,node_id);
    pcVar7 = pcVar5->str;
    sVar6 = pcVar5->len;
  }
  pNVar4 = Tree::_p(this->m_tree,node_id);
  if ((((~(int)(pNVar4->m_type).type & 0x1001U) != 0) && (sVar6 != 0)) && (*pcVar7 == '*')) {
    pNVar4 = Tree::_p(this->m_tree,node_id);
    NVar1 = (pNVar4->m_type).type;
    if ((NVar1 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar1 >> 9 & 1) != 0) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      cStack_30 = to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
      local_48.str._0_4_ = 0;
      local_48.str._4_4_ = 0;
      local_48.len._0_4_ = 0x7715;
      local_48.len._4_4_ = 0;
      local_38 = 0;
      (*(code *)PTR_error_impl_00234578)
                ("check failed: !m_tree->has_val_anchor(node_id)",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this_00 = this->m_tree;
    basic_substring<const_char>::basic_substring(&local_48,pcVar7 + 1,sVar6 - 1);
    ref.str._4_4_ = local_48.str._4_4_;
    ref.str._0_4_ = local_48.str._0_4_;
    ref.len._0_4_ = (undefined4)local_48.len;
    ref.len._4_4_ = local_48.len._4_4_;
    Tree::set_val_ref(this_00,node_id,ref);
  }
  return;
}

Assistant:

void Parser::_write_val_anchor(size_t node_id)
{
    if( ! m_val_anchor.empty())
    {
        _c4dbgpf("node={}: set val anchor to '{}'", node_id, m_val_anchor);
        m_tree->set_val_anchor(node_id, m_val_anchor);
        m_val_anchor.clear();
    }
    csubstr r = m_tree->has_val(node_id) ? m_tree->val(node_id) : "";
    if(!m_tree->is_val_quoted(node_id) && r.begins_with('*'))
    {
        _c4dbgpf("node={}: set val reference: '{}'", node_id, r);
        RYML_CHECK(!m_tree->has_val_anchor(node_id));
        m_tree->set_val_ref(node_id, r.sub(1));
    }
}